

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ext_ticket_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *ssl;
  SSL_SESSION *session;
  ssl_session_st *psVar1;
  uint32_t uVar2;
  SSLSessionType SVar3;
  int iVar4;
  bool bVar5;
  uchar *data;
  size_t len;
  CBB ticket_cbb;
  CBB CStack_58;
  
  bVar5 = true;
  if ((type != ssl_client_hello_inner) && (hs->min_version < 0x304)) {
    ssl = hs->ssl;
    uVar2 = SSL_get_options(ssl);
    if ((uVar2 >> 0xe & 1) == 0) {
      len = 0;
      data = (uint8_t *)0x0;
      if ((ssl->s3->field_0xdc & 0x10) == 0) {
        session = (ssl->session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
                  ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
        if (session == (SSL_SESSION *)0x0) {
          len = 0;
          data = (uint8_t *)0x0;
        }
        else {
          SVar3 = ssl_session_get_type(session);
          len = 0;
          data = (uint8_t *)0x0;
          if (SVar3 == kTicket) {
            psVar1 = (ssl->session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
            data = (psVar1->ticket).data_;
            len = (psVar1->ticket).size_;
          }
        }
      }
      iVar4 = CBB_add_u16(out,0x23);
      if (((iVar4 != 0) && (iVar4 = CBB_add_u16_length_prefixed(out,&CStack_58), iVar4 != 0)) &&
         (iVar4 = CBB_add_bytes(&CStack_58,data,len), iVar4 != 0)) {
        iVar4 = CBB_flush(out);
        return iVar4 != 0;
      }
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

static bool ext_ticket_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                       CBB *out_compressible,
                                       ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  // TLS 1.3 uses a different ticket extension.
  if (hs->min_version >= TLS1_3_VERSION || type == ssl_client_hello_inner ||
      SSL_get_options(ssl) & SSL_OP_NO_TICKET) {
    return true;
  }

  // Renegotiation does not participate in session resumption. However, still
  // advertise the extension to avoid potentially breaking servers which carry
  // over the state from the previous handshake, such as OpenSSL servers
  // without upstream's 3c3f0259238594d77264a78944d409f2127642c4.
  Span<const uint8_t> ticket;
  if (!ssl->s3->initial_handshake_complete &&  //
      ssl->session != nullptr &&
      ssl_session_get_type(ssl->session.get()) == SSLSessionType::kTicket) {
    ticket = ssl->session->ticket;
  }

  CBB ticket_cbb;
  if (!CBB_add_u16(out, TLSEXT_TYPE_session_ticket) ||
      !CBB_add_u16_length_prefixed(out, &ticket_cbb) ||
      !CBB_add_bytes(&ticket_cbb, ticket.data(), ticket.size()) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}